

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_functions.cpp
# Opt level: O0

void Am_Delete_Char_After_Cursor(Am_Object *text)

{
  bool bVar1;
  Am_Code_Flag AVar2;
  Am_Value *pAVar3;
  char *pcVar4;
  char *head;
  long lVar5;
  Am_String local_68;
  Am_String local_60;
  Am_String local_58;
  Am_String local_50;
  Am_Object local_48;
  char *local_40;
  char *new_str;
  int str_len;
  Am_String old_str;
  int cursor_index;
  Am_Object local_18;
  Am_Object *local_10;
  Am_Object *text_local;
  
  local_10 = text;
  pAVar3 = Am_Object::Get(text,0xe4,0);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar3);
  if (bVar1) {
    Am_Object::Am_Object(&local_18,text);
    Am_Delete_Entire_String(&local_18);
    Am_Object::~Am_Object(&local_18);
    return;
  }
  pAVar3 = Am_Object::Get(text,0xad,0);
  old_str.data._0_4_ = Am_Value::operator_cast_to_int(pAVar3);
  pAVar3 = Am_Object::Get(text,0xab,0);
  Am_String::Am_String((Am_String *)&stack0xffffffffffffffd0,pAVar3);
  pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffd0);
  new_str._4_4_ = ml_strlen(pcVar4);
  Am_Object::Am_Object(&local_48,text);
  AVar2 = ml_which_code(&local_48);
  Am_Object::~Am_Object(&local_48);
  if (AVar2 == Am_ONE_BYTE_CODE) {
    if ((-1 < (int)old_str.data) && ((int)old_str.data < new_str._4_4_)) {
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffd0);
      local_40 = Am_Delete_Substring(pcVar4,(int)old_str.data,(int)old_str.data + 1);
      Am_String::Am_String(&local_50,local_40,false);
      Am_Object::Set(text,0xab,&local_50,0);
      Am_String::~Am_String(&local_50);
    }
  }
  else if (AVar2 == Am_TWO_BYTE_CODE) {
    if ((-1 < (int)old_str.data) && ((int)old_str.data < new_str._4_4_ + -1)) {
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffd0);
      local_40 = Am_Delete_Substring(pcVar4,(int)old_str.data,(int)old_str.data + 2);
      Am_String::Am_String(&local_58,local_40,false);
      Am_Object::Set(text,0xab,&local_58,0);
      Am_String::~Am_String(&local_58);
    }
  }
  else if (AVar2 == Am_SHIFT_JIS_CODE) {
    if ((-1 < (int)old_str.data) && ((int)old_str.data < new_str._4_4_ + -1)) {
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffd0);
      lVar5 = (long)(int)old_str.data;
      head = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffd0);
      bVar1 = ml_two_byte_SHIFT_JIS(pcVar4 + lVar5,head);
      if (bVar1) {
        pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffd0);
        local_40 = Am_Delete_Substring(pcVar4,(int)old_str.data,(int)old_str.data + 2);
        Am_String::Am_String(&local_60,local_40,false);
        Am_Object::Set(text,0xab,&local_60,0);
        Am_String::~Am_String(&local_60);
        goto LAB_0027b7c3;
      }
    }
    if ((-1 < (int)old_str.data) && ((int)old_str.data < new_str._4_4_)) {
      pcVar4 = Am_String::operator_cast_to_char_((Am_String *)&stack0xffffffffffffffd0);
      local_40 = Am_Delete_Substring(pcVar4,(int)old_str.data,(int)old_str.data + 1);
      Am_String::Am_String(&local_68,local_40,false);
      Am_Object::Set(text,0xab,&local_68,0);
      Am_String::~Am_String(&local_68);
    }
  }
LAB_0027b7c3:
  Am_String::~Am_String((Am_String *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void
Am_Delete_Char_After_Cursor(Am_Object text)
{
  if ((bool)text.Get(Am_PENDING_DELETE)) //delete all text first
    Am_Delete_Entire_String(text);
  else {
    int cursor_index = text.Get(Am_CURSOR_INDEX);
    Am_String old_str = text.Get(Am_TEXT);
    int str_len = ml_strlen((const char *)old_str);
    char *new_str;

    switch (ml_which_code(text)) {
    case Am_ONE_BYTE_CODE:
      if (0 <= cursor_index && cursor_index < str_len) {
        new_str = Am_Delete_Substring(old_str, cursor_index, cursor_index + 1);
        text.Set(Am_TEXT, Am_String(new_str, false));
      }
      break;
    case Am_TWO_BYTE_CODE:
      if (0 <= cursor_index && cursor_index < str_len - 1) {
        new_str = Am_Delete_Substring(old_str, cursor_index, cursor_index + 2);
        text.Set(Am_TEXT, Am_String(new_str, false));
      }
      break;
    case Am_SHIFT_JIS_CODE:
      if (0 <= cursor_index && cursor_index < str_len - 1 &&
          ml_two_byte_SHIFT_JIS(&(((const char *)old_str)[cursor_index]),
                                (const char *)old_str)) {
        new_str = Am_Delete_Substring(old_str, cursor_index, cursor_index + 2);
        text.Set(Am_TEXT, Am_String(new_str, false));
      } else if (0 <= cursor_index && cursor_index < str_len) {
        new_str = Am_Delete_Substring(old_str, cursor_index, cursor_index + 1);
        text.Set(Am_TEXT, Am_String(new_str, false));
      }
      break;
    }
  }
}